

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Buffer::bass_freq(Blip_Buffer *this,int freq)

{
  int in_ESI;
  long in_RDI;
  double dVar1;
  
  *(int *)(in_RDI + 0x40) = in_ESI;
  if (in_ESI == 0) {
    *(undefined4 *)(in_RDI + 0x28) = 0x1f;
  }
  else {
    dVar1 = log(((double)*(long *)(in_RDI + 0x30) * 0.124) / (double)in_ESI);
    dVar1 = floor(dVar1 * 1.442695041);
    *(int *)(in_RDI + 0x28) = (int)dVar1 + 1;
    if (*(int *)(in_RDI + 0x28) < 0) {
      *(undefined4 *)(in_RDI + 0x28) = 0;
    }
    if (0x18 < *(int *)(in_RDI + 0x28)) {
      *(undefined4 *)(in_RDI + 0x28) = 0x18;
    }
  }
  return;
}

Assistant:

void Blip_Buffer::bass_freq( int freq )
{
	bass_freq_ = freq;
	if ( freq == 0 ) {
		bass_shift = 31; // 32 or greater invokes undefined behavior elsewhere
		return;
	}
	bass_shift = 1 + (int) floor( 1.442695041 * log( 0.124 * samples_per_sec / freq ) );
	if ( bass_shift < 0 )
		bass_shift = 0;
	if ( bass_shift > 24 )
		bass_shift = 24;
}